

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::HlslParseContext::handleInputGeometry
          (HlslParseContext *this,TSourceLoc *loc,TLayoutGeometry *geometry)

{
  TLayoutGeometry geometry_00;
  TLayoutGeometry TVar1;
  TIntermediate *pTVar2;
  char *pcVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  
  if (this->parsingEntrypointParameters != true) {
    return true;
  }
  geometry_00 = *geometry;
  if ((geometry_00 < ElgTriangleStrip) && ((0x6eU >> (geometry_00 & 0x1f) & 1) != 0)) {
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar1 = pTVar2->inputPrimitive;
    if (TVar1 == ElgNone) {
      pTVar2->inputPrimitive = geometry_00;
      return true;
    }
    if (TVar1 == geometry_00) {
      return true;
    }
    pcVar3 = TQualifier::getGeometryString(geometry_00);
    pp_Var5 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = "input primitive geometry redefinition";
  }
  else {
    pcVar3 = TQualifier::getGeometryString(geometry_00);
    pp_Var5 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = "cannot apply to \'in\'";
  }
  (*pp_Var5[0x2d])(this,loc,pcVar4,pcVar3,"");
  return false;
}

Assistant:

bool HlslParseContext::handleInputGeometry(const TSourceLoc& loc, const TLayoutGeometry& geometry)
{
    // these can be declared on non-entry-points, in which case they lose their meaning
    if (! parsingEntrypointParameters)
        return true;

    switch (geometry) {
    case ElgPoints:             // fall through
    case ElgLines:              // ...
    case ElgTriangles:          // ...
    case ElgLinesAdjacency:     // ...
    case ElgTrianglesAdjacency: // ...
        if (! intermediate.setInputPrimitive(geometry)) {
            error(loc, "input primitive geometry redefinition", TQualifier::getGeometryString(geometry), "");
            return false;
        }
        break;

    default:
        error(loc, "cannot apply to 'in'", TQualifier::getGeometryString(geometry), "");
        return false;
    }

    return true;
}